

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDocked(ImGuiWindow *window,bool *p_open)

{
  long lVar1;
  bool bVar2;
  ImGuiIO *pIVar3;
  ImGuiContext *pIVar4;
  undefined1 uVar5;
  bool bVar6;
  ImGuiID IVar7;
  int iVar8;
  ImGuiContext *ctx_00;
  ImGuiWindow *window_00;
  undefined1 *in_RSI;
  ImGuiWindow *in_RDI;
  ImGuiWindow *parent_window;
  ImGuiDockNode *root_node;
  ImGuiDockNode *node;
  bool want_undock;
  bool auto_dock_node;
  ImGuiContext *g;
  ImGuiContext *ctx;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar9;
  ImGuiWindow *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  ImGuiWindow *in_stack_ffffffffffffffc8;
  ImGuiContext *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffde;
  
  pIVar4 = GImGui;
  uVar5 = GetWindowAlwaysWantOwnTabBar(in_RDI);
  if ((bool)uVar5) {
    if (in_RDI->DockId == 0) {
      IVar7 = DockContextGenNodeID
                        ((ImGuiContext *)
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      in_RDI->DockId = IVar7;
    }
  }
  else {
    bVar6 = (in_RDI->Flags & 0x200000U) != 0;
    bVar9 = 0;
    if ((((pIVar4->NextWindowData).Flags & 1U) != 0) &&
       (bVar9 = 0, (in_RDI->SetWindowPosAllowFlags & (pIVar4->NextWindowData).PosCond) != 0)) {
      bVar9 = (pIVar4->NextWindowData).PosUndock;
    }
    bVar2 = (bVar9 & 1) != 0;
    in_stack_ffffffffffffffde = bVar6 || bVar2;
    if (bVar6 || bVar2) {
      DockContextProcessUndockWindow
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7
                );
      return;
    }
  }
  ctx_00 = (ImGuiContext *)in_RDI->DockNode;
  if (((in_RDI->DockId == 0) || (ctx_00 != (ImGuiContext *)0x0)) ||
     (ctx_00 = (ImGuiContext *)
               DockContextBindNodeToWindow
                         ((ImGuiContext *)
                          CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffde,
                                                  in_stack_ffffffffffffffd8)),(ImGuiWindow *)0x0),
     ctx_00 != (ImGuiContext *)0x0)) {
    if ((int)(ctx_00->IO).KeyRepeatRate < pIVar4->FrameCount) {
      window_00 = (ImGuiWindow *)DockNodeGetRootNode((ImGuiDockNode *)ctx_00);
      if ((int)(window_00->ScrollTarget).y < pIVar4->FrameCount) {
        DockContextProcessUndockWindow(ctx_00,window_00,(bool)in_stack_ffffffffffffffc7);
      }
      else {
        in_RDI->field_0x43a = in_RDI->field_0x43a & 0xfe | 1;
        in_RDI->field_0x43a = in_RDI->field_0x43a & 0xfd;
      }
    }
    else if (*(long *)((ctx_00->IO).KeyMap + 0xf) == 0) {
      in_RDI->field_0x43a = in_RDI->field_0x43a & 0xfe | (ctx_00->IO).KeyMap[0xd] == 2;
      in_RDI->field_0x43a = in_RDI->field_0x43a & 0xfd;
    }
    else {
      (ctx_00->IO).KeyMap[0xd] = 3;
      if (in_RDI->BeginOrderWithinContext < *(short *)(*(long *)((ctx_00->IO).KeyMap + 0xf) + 0xbe))
      {
        DockContextProcessUndockWindow
                  (ctx_00,in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
      }
      else {
        pIVar3 = &ctx_00->IO;
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc0,0.0,0.0);
        SetNextWindowPos((ImVec2 *)(pIVar3->KeyMap + 1),0,(ImVec2 *)&stack0xffffffffffffffc0);
        SetNextWindowSize((ImVec2 *)((ctx_00->IO).KeyMap + 3),0);
        (pIVar4->NextWindowData).PosUndock = false;
        in_RDI->field_0x43a = in_RDI->field_0x43a & 0xfe | 1;
        in_RDI->field_0x43a = in_RDI->field_0x43a & 0xfd;
        if ((*(uint *)&ctx_00->field_0x4 & 1) == 0) {
          if (*(ImGuiWindow **)((ctx_00->IO).KeyMap + 0x11) == in_RDI) {
            in_RDI->field_0x43a = in_RDI->field_0x43a & 0xfd | 2;
          }
          in_RDI->Flags = in_RDI->Flags | 0x1010002;
          bVar6 = ImGuiDockNode::IsHiddenTabBar((ImGuiDockNode *)ctx_00);
          if ((bVar6) || (bVar6 = ImGuiDockNode::IsNoTabBar((ImGuiDockNode *)ctx_00), bVar6)) {
            in_RDI->Flags = in_RDI->Flags | 1;
          }
          else {
            in_RDI->Flags = in_RDI->Flags & 0xfffffffe;
          }
          lVar1._0_4_ = (ctx_00->IO).MouseDragThreshold;
          lVar1._4_4_ = (ctx_00->IO).KeyMap[0];
          if ((lVar1 != 0) && (*(int *)(*(long *)&(ctx_00->IO).MouseDragThreshold + 0x20) != -1)) {
            iVar8 = DockNodeGetTabOrder(in_stack_ffffffffffffffb8);
            in_RDI->DockOrder = (short)iVar8;
          }
          if ((((*(ushort *)&(ctx_00->IO).FontGlobalScale >> 0xe & 1) != 0) ||
              (*(ImGuiID *)((long)&(ctx_00->IO).Fonts + 4) == in_RDI->ID)) &&
             (in_RSI != (undefined1 *)0x0)) {
            *in_RSI = 0;
          }
          IVar7 = ImGuiWindow::GetID((ImGuiWindow *)ctx_00,(char *)in_stack_ffffffffffffffc8,
                                     (char *)CONCAT17(in_stack_ffffffffffffffc7,
                                                      in_stack_ffffffffffffffc0));
          in_RDI->ChildId = IVar7;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::BeginDocked(ImGuiWindow* window, bool* p_open)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    const bool auto_dock_node = GetWindowAlwaysWantOwnTabBar(window);
    if (auto_dock_node)
    {
        if (window->DockId == 0)
        {
            IM_ASSERT(window->DockNode == NULL);
            window->DockId = DockContextGenNodeID(ctx);
        }
    }
    else
    {
        // Calling SetNextWindowPos() undock windows by default (by setting PosUndock)
        bool want_undock = false;
        want_undock |= (window->Flags & ImGuiWindowFlags_NoDocking) != 0;
        want_undock |= (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) && (window->SetWindowPosAllowFlags & g.NextWindowData.PosCond) && g.NextWindowData.PosUndock;
        if (want_undock)
        {
            DockContextProcessUndockWindow(ctx, window);
            return;
        }
    }

    // Bind to our dock node
    ImGuiDockNode* node = window->DockNode;
    if (node != NULL)
        IM_ASSERT(window->DockId == node->ID);
    if (window->DockId != 0 && node == NULL)
    {
        node = DockContextBindNodeToWindow(ctx, window);
        if (node == NULL)
            return;
    }

#if 0
    // Undock if the ImGuiDockNodeFlags_NoDockingInCentralNode got set
    if (node->IsCentralNode && (node->Flags & ImGuiDockNodeFlags_NoDockingInCentralNode))
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }
#endif

    // Undock if our dockspace node disappeared
    // Note how we are testing for LastFrameAlive and NOT LastFrameActive. A DockSpace node can be maintained alive while being inactive with ImGuiDockNodeFlags_KeepAliveOnly.
    if (node->LastFrameAlive < g.FrameCount)
    {
        // If the window has been orphaned, transition the docknode to an implicit node processed in DockContextUpdateDocking()
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        if (root_node->LastFrameAlive < g.FrameCount)
        {
            DockContextProcessUndockWindow(ctx, window);
        }
        else
        {
            window->DockIsActive = true;
            window->DockTabIsVisible = false;
        }
        return;
    }

    // Fast path return. It is common for windows to hold on a persistent DockId but be the only visible window,
    // and never create neither a host window neither a tab bar.
    // FIXME-DOCK: replace ->HostWindow NULL compare with something more explicit (~was initially intended as a first frame test)
    if (node->HostWindow == NULL)
    {
        window->DockIsActive = (node->State == ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing);
        window->DockTabIsVisible = false;
        return;
    }

    // We can have zero-sized nodes (e.g. children of a small-size dockspace)
    IM_ASSERT(node->HostWindow);
    IM_ASSERT(node->IsLeafNode());
    IM_ASSERT(node->Size.x >= 0.0f && node->Size.y >= 0.0f);
    node->State = ImGuiDockNodeState_HostWindowVisible;

    // Undock if we are submitted earlier than the host window
    if (window->BeginOrderWithinContext < node->HostWindow->BeginOrderWithinContext)
    {
        DockContextProcessUndockWindow(ctx, window);
        return;
    }

    // Position/Size window
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false; // Cancel implicit undocking of SetNextWindowPos()
    window->DockIsActive = true;
    window->DockTabIsVisible = false;
    if (node->SharedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return;

    // When the window is selected we mark it as visible.
    if (node->VisibleWindow == window)
        window->DockTabIsVisible = true;

    // Update window flag
    IM_ASSERT((window->Flags & ImGuiWindowFlags_ChildWindow) == 0);
    window->Flags |= ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysUseWindowPadding | ImGuiWindowFlags_NoResize;
    if (node->IsHiddenTabBar() || node->IsNoTabBar())
        window->Flags |= ImGuiWindowFlags_NoTitleBar;
    else
        window->Flags &= ~ImGuiWindowFlags_NoTitleBar;      // Clear the NoTitleBar flag in case the user set it: confusingly enough we need a title bar height so we are correctly offset, but it won't be displayed!

    // Save new dock order only if the tab bar has been visible once.
    // This allows multiple windows to be created in the same frame and have their respective dock orders preserved.
    if (node->TabBar && node->TabBar->CurrFrameVisible != -1)
        window->DockOrder = (short)DockNodeGetTabOrder(window);

    if ((node->WantCloseAll || node->WantCloseTabID == window->ID) && p_open != NULL)
        *p_open = false;

    // Update ChildId to allow returning from Child to Parent with Escape
    ImGuiWindow* parent_window = window->DockNode->HostWindow;
    window->ChildId = parent_window->GetID(window->Name);
}